

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::GetTests
          (cmMakefile *this,string *config,vector<cmTest_*,_std::allocator<cmTest_*>_> *tests)

{
  bool bVar1;
  vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *this_00;
  reference ppcVar2;
  cmTest *local_48;
  cmTestGenerator *local_40;
  cmTestGenerator *generator;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *__range1;
  vector<cmTest_*,_std::allocator<cmTest_*>_> *tests_local;
  string *config_local;
  cmMakefile *this_local;
  
  this_00 = GetTestGenerators(this);
  __end1 = std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::begin(this_00);
  generator = (cmTestGenerator *)
              std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                                     *)&generator), bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
              ::operator*(&__end1);
    local_40 = *ppcVar2;
    bVar1 = cmTestGenerator::TestsForConfig(local_40,config);
    if (bVar1) {
      local_48 = cmTestGenerator::GetTest(local_40);
      std::vector<cmTest_*,_std::allocator<cmTest_*>_>::push_back(tests,&local_48);
    }
    __gnu_cxx::
    __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmMakefile::GetTests(const std::string& config,
                          std::vector<cmTest*>& tests)
{
  for (auto generator : this->GetTestGenerators()) {
    if (generator->TestsForConfig(config)) {
      tests.push_back(generator->GetTest());
    }
  }
}